

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::ResultBuilder::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,ResultBuilder *this)

{
  string *psVar1;
  string *__lhs;
  string *__rhs;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar1 = &(this->m_exprComponents).op;
  bVar2 = std::operator==(psVar1,"");
  if (!bVar2) {
    bVar2 = std::operator==(psVar1,"matches");
    if (bVar2) {
      std::operator+(&local_50,&(this->m_exprComponents).lhs," ");
      std::operator+(__return_storage_ptr__,&local_50,&(this->m_exprComponents).rhs);
      this_00 = &local_50;
    }
    else {
      bVar2 = std::operator!=(psVar1,"!");
      if (bVar2) {
        __lhs = &(this->m_exprComponents).lhs;
        __rhs = &(this->m_exprComponents).rhs;
        if ((((this->m_exprComponents).rhs._M_string_length +
              (this->m_exprComponents).lhs._M_string_length < 0x28) &&
            (lVar3 = std::__cxx11::string::find((char *)__lhs,0x166b22), lVar3 == -1)) &&
           (lVar3 = std::__cxx11::string::find((char *)__rhs,0x166b22), lVar3 == -1)) {
          std::operator+(&local_90,__lhs," ");
          std::operator+(&local_70,&local_90,psVar1);
          std::operator+(&local_50,&local_70," ");
          std::operator+(__return_storage_ptr__,&local_50,__rhs);
        }
        else {
          std::operator+(&local_90,__lhs,"\n");
          std::operator+(&local_70,&local_90,psVar1);
          std::operator+(&local_50,&local_70,"\n");
          std::operator+(__return_storage_ptr__,&local_50,__rhs);
        }
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = &local_90;
      }
      else {
        std::operator+(&local_130,"{can\'t expand - use ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        std::operator+(&local_d0,&local_130,"_FALSE( ");
        psVar1 = &(this->m_assertionInfo).capturedExpression;
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)psVar1);
        std::operator+(&local_f0,&local_d0,&local_b0);
        std::operator+(&local_110,&local_f0," ) instead of ");
        std::operator+(&local_90,&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        std::operator+(&local_70,&local_90,"( ");
        std::operator+(&local_50,&local_70,psVar1);
        std::operator+(__return_storage_ptr__,&local_50," ) for better diagnostics}");
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        this_00 = &local_130;
      }
    }
    std::__cxx11::string::~string((string *)this_00);
    return __return_storage_ptr__;
  }
  if ((this->m_exprComponents).lhs._M_string_length != 0) {
    std::operator+(__return_storage_ptr__,psVar1,&(this->m_exprComponents).lhs);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(this->m_assertionInfo).capturedExpression)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string ResultBuilder::reconstructExpression() const {
		if (m_exprComponents.op == "")
			return m_exprComponents.lhs.empty() ? m_assertionInfo.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
		else if (m_exprComponents.op == "matches")
			return m_exprComponents.lhs + " " + m_exprComponents.rhs;
		else if (m_exprComponents.op != "!") {
			if (m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
				m_exprComponents.lhs.find("\n") == std::string::npos &&
				m_exprComponents.rhs.find("\n") == std::string::npos)
				return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
			else
				return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
		}
		else
			return "{can't expand - use " + m_assertionInfo.macroName + "_FALSE( " + m_assertionInfo.capturedExpression.substr(1) + " ) instead of " + m_assertionInfo.macroName + "( " + m_assertionInfo.capturedExpression + " ) for better diagnostics}";
	}